

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

bool __thiscall
Clasp::Asp::LogicProgram::simplifyNormal
          (LogicProgram *this,Head_t ht,AtomSpan *head,LitSpan *body,RuleBuilder *out,SRule *meta)

{
  byte bVar1;
  bool bVar2;
  Atom_t AVar3;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  RuleBuilder *pRVar7;
  RuleBuilder *out_00;
  size_t x;
  Var v_00;
  Span<int> *in_RCX;
  size_t *siglen;
  uchar *sig;
  uchar *sig_00;
  EVP_PKEY_CTX *pEVar8;
  long in_RDI;
  RuleBuilder *in_R8;
  RuleBuilder *tbs;
  uint *in_R9;
  Lit_t *it_1;
  uint32_t bs;
  ValueRep v;
  Literal p;
  PrgAtom *a;
  iterator end;
  iterator it;
  bool ok;
  Literal *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar9;
  undefined4 in_stack_ffffffffffffff38;
  Lit_t in_stack_ffffffffffffff3c;
  RuleBuilder *in_stack_ffffffffffffff40;
  bool local_a1;
  Lit_t *local_98;
  Body_t local_8c [3];
  uint32 local_78;
  Literal in_stack_ffffffffffffff8c;
  Literal in_stack_ffffffffffffff90;
  Literal in_stack_ffffffffffffff94;
  Literal in_stack_ffffffffffffff98;
  Literal in_stack_ffffffffffffff9c;
  Body_t in_stack_ffffffffffffffa0;
  Literal local_5c;
  PrgAtom *local_58;
  weight_t slack;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar10;
  uint32 in_stack_ffffffffffffffc4;
  uint32 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint *puVar11;
  
  tbs = in_R8;
  puVar11 = in_R9;
  Potassco::RuleBuilder::clear
            ((RuleBuilder *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  Potassco::RuleBuilder::startBody
            ((RuleBuilder *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  SRule::SRule((SRule *)&stack0xffffffffffffffc4);
  *(ulong *)puVar11 = CONCAT44(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  siglen = (size_t *)(ulong)in_stack_ffffffffffffffcc;
  puVar11[2] = in_stack_ffffffffffffffcc;
  uVar10 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  pRVar7 = (RuleBuilder *)Potassco::begin<int>(in_RCX);
  out_00 = (RuleBuilder *)Potassco::end<int>((Span<int> *)0x17b071);
  do {
    if (pRVar7 == out_00) {
LAB_0017b27c:
      slack = (weight_t)((ulong)pRVar7 >> 0x20);
      join_0x00000010_0x00000000_ =
           Potassco::RuleBuilder::body
                     ((RuleBuilder *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      x = Potassco::size<int>((Span<int> *)(local_8c + 1));
      local_78 = toU32(x);
      if ((uVar10 & 0x1000000) == 0) {
        uVar4 = 0x40000000;
      }
      else {
        Potassco::Body_t::Body_t(local_8c,Normal);
        uVar4 = findBody((LogicProgram *)
                         CONCAT44(in_stack_ffffffffffffff9c.rep_,in_stack_ffffffffffffff98.rep_),
                         in_stack_ffffffffffffff94.rep_,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff90.rep_,in_stack_ffffffffffffff8c.rep_,
                         local_8c._12_8_);
      }
      puVar11[2] = uVar4;
      uVar9 = false;
      if ((uVar10 & 0x1000000) != 0) {
        uVar9 = pushHead((LogicProgram *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (Head_t)(E)((ulong)puVar11 >> 0x20),
                         (AtomSpan *)CONCAT44(in_stack_ffffffffffffffc4,uVar10),slack,out_00);
      }
      iVar6 = (uint)(byte)uVar9 << 0x18;
      local_98 = Potassco::RuleBuilder::lits_begin
                           ((RuleBuilder *)CONCAT17(uVar9,in_stack_ffffffffffffff30));
      while (local_78 != 0) {
        v_00 = (Var)((ulong)(in_RDI + 0x98) >> 0x20);
        Potassco::atom(*local_98);
        AtomState::clearRule((AtomState *)CONCAT17(uVar9,in_stack_ffffffffffffff30),v_00);
        local_98 = local_98 + 1;
        local_78 = local_78 - 1;
      }
      return (bool)((byte)((uint)iVar6 >> 0x18) & 1);
    }
    AVar3 = Potassco::atom(*(Lit_t *)&(pRVar7->mem_).beg_);
    if (0xfffffff < AVar3) {
      Potassco::fail(0x4b,
                     "bool Clasp::Asp::LogicProgram::simplifyNormal(Head_t, const Potassco::AtomSpan &, const Potassco::LitSpan &, RuleBuilder &, SRule &)"
                     ,0x712,"Potassco::atom(*it) < bodyId","Atom out of bounds",0);
    }
    Potassco::atom(*(Lit_t *)&(pRVar7->mem_).beg_);
    local_58 = resize((LogicProgram *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                      (Atom_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    uVar4 = PrgNode::id((PrgNode *)local_58);
    pEVar8 = (EVP_PKEY_CTX *)(ulong)uVar4;
    Literal::Literal(&local_5c,uVar4,*(int *)&(pRVar7->mem_).beg_ < 0);
    Literal::sign(&local_5c,pEVar8,sig,siglen,(uchar *)tbs,(size_t)in_R9);
    bVar1 = litVal((LogicProgram *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (PrgAtom *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                   SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
    in_stack_ffffffffffffffa0.val_ = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa0.val_);
    siglen = (size_t *)(ulong)bVar1;
    local_a1 = true;
    if (bVar1 != 2) {
      in_stack_ffffffffffffff9c = Literal::operator~(in_stack_ffffffffffffff28);
      local_a1 = AtomState::inBody((AtomState *)
                                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                   (Literal)(uint32)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    }
    if (local_a1 != false) {
      uVar10 = uVar10 & 0xffffff;
      goto LAB_0017b27c;
    }
    if ((char)(in_stack_ffffffffffffffa0.val_ >> 0x18) != '\x01') {
      in_stack_ffffffffffffff98.rep_ = local_5c.rep_;
      bVar2 = AtomState::inBody((AtomState *)
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                (Literal)(uint32)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      if (!bVar2) {
        in_stack_ffffffffffffff94.rep_ = local_5c.rep_;
        AtomState::addToBody
                  ((AtomState *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (Literal)(uint32)((ulong)in_stack_ffffffffffffff40 >> 0x20));
        in_stack_ffffffffffffff40 = in_R8;
        in_stack_ffffffffffffff90.rep_ = local_5c.rep_;
        uVar5 = toInt((Literal)0x0);
        pEVar8 = (EVP_PKEY_CTX *)(ulong)uVar5;
        Potassco::RuleBuilder::addGoal(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        iVar6 = Literal::sign(&local_5c,pEVar8,sig_00,siglen,(uchar *)tbs,(size_t)in_R9);
        puVar11[1] = (uint)(((byte)iVar6 ^ 0xff) & 1) + puVar11[1];
        in_stack_ffffffffffffff8c.rep_ = local_5c.rep_;
        uVar4 = hashLit((Literal)0x0);
        siglen = (size_t *)(ulong)(uVar4 + *puVar11);
        *puVar11 = uVar4 + *puVar11;
      }
    }
    pRVar7 = (RuleBuilder *)((long)&(pRVar7->mem_).beg_ + 4);
  } while( true );
}

Assistant:

bool LogicProgram::simplifyNormal(Head_t ht, const Potassco::AtomSpan& head, const Potassco::LitSpan& body, RuleBuilder& out, SRule& meta) {
	out.clear();
	out.startBody();
	meta = SRule();
	bool ok = true;
	for (Potassco::LitSpan::iterator it = Potassco::begin(body), end = Potassco::end(body); it != end; ++it) {
		POTASSCO_CHECK(Potassco::atom(*it) < bodyId, EOVERFLOW, "Atom out of bounds");
		PrgAtom* a = resize(Potassco::atom(*it));
		Literal  p = Literal(a->id(), *it < 0);// replace any eq atoms
		ValueRep v = litVal(a, !p.sign());
		if (v == value_false || atomState_.inBody(~p)) {
			ok = false;
			break;
		}
		else if (v != value_true  && !atomState_.inBody(p)) {
			atomState_.addToBody(p);
			out.addGoal(toInt(p));
			meta.pos  += !p.sign();
			meta.hash += hashLit(p);
		}
	}
	uint32_t bs = toU32(size(out.body()));
	meta.bid = ok ? findBody(meta.hash, Body_t::Normal, bs) : varMax;
	ok = ok && pushHead(ht, head, 0, out);
	for (const Potassco::Lit_t* it = out.lits_begin(); bs--;) {
		atomState_.clearRule(Potassco::atom(*it++));
	}
	return ok;
}